

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DMDecoder.cpp
# Opt level: O1

DecoderResult * ZXing::DataMatrix::Decode(DecoderResult *__return_storage_ptr__,BitMatrix *bits)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  uint uVar4;
  DecoderResult res;
  BitMatrix local_120;
  DecoderResult local_100;
  
  DoDecode(&local_100,bits);
  if ((local_100._content.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_start ==
       local_100._content.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_finish) || (local_100._error._type != None)) {
    BitMatrix::BitMatrix(&local_120,bits->_height,bits->_width);
    if (0 < local_120._height) {
      uVar4 = 0;
      do {
        if (0 < local_120._width) {
          iVar2 = -1;
          lVar3 = 0;
          do {
            bVar1 = BitMatrix::get(bits,bits->_width + ~uVar4,bits->_height + iVar2);
            if ((ulong)((long)local_120._bits.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)local_120._bits.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start) <=
                (ulong)((int)(local_120._width * uVar4) + lVar3)) {
              std::__throw_out_of_range_fmt
                        ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                        );
            }
            local_120._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start[lVar3 + (int)(local_120._width * uVar4)] =
                 -bVar1;
            lVar3 = lVar3 + 1;
            iVar2 = iVar2 + -1;
          } while ((int)lVar3 < local_120._width);
        }
        uVar4 = uVar4 + 1;
      } while ((int)uVar4 < local_120._height);
    }
    DoDecode(__return_storage_ptr__,&local_120);
    if (local_120._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_120._bits.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_120._bits.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_120._bits.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (((__return_storage_ptr__->_content).bytes.
         super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start !=
         (__return_storage_ptr__->_content).bytes.
         super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_finish) && ((__return_storage_ptr__->_error)._type == None)) {
      __return_storage_ptr__->_isMirrored = true;
      goto LAB_0014ebfa;
    }
    DecoderResult::~DecoderResult(__return_storage_ptr__);
  }
  DecoderResult::DecoderResult(__return_storage_ptr__,&local_100);
LAB_0014ebfa:
  if (local_100._extra.super___shared_ptr<ZXing::CustomData,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_100._extra.super___shared_ptr<ZXing::CustomData,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._error._msg._M_dataplus._M_p != &local_100._error._msg.field_2) {
    operator_delete(local_100._error._msg._M_dataplus._M_p,
                    local_100._error._msg.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._structuredAppend.id._M_dataplus._M_p != &local_100._structuredAppend.id.field_2)
  {
    operator_delete(local_100._structuredAppend.id._M_dataplus._M_p,
                    local_100._structuredAppend.id.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._ecLevel._M_dataplus._M_p != &local_100._ecLevel.field_2) {
    operator_delete(local_100._ecLevel._M_dataplus._M_p,
                    local_100._ecLevel.field_2._M_allocated_capacity + 1);
  }
  if (local_100._content.encodings.
      super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_100._content.encodings.
                    super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_100._content.encodings.
                          super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_100._content.encodings.
                          super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_100._content.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_100._content.bytes.
                    super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_100._content.bytes.
                          super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_100._content.bytes.
                          super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

DecoderResult Decode(const BitMatrix& bits)
{
	auto res = DoDecode(bits);
	if (res.isValid())
		return res;

	//TODO:
	// * unify bit mirroring helper code with QRReader?
	// * rectangular symbols with the a size of 8 x Y are not supported a.t.m.
	if (auto mirroredRes = DoDecode(FlippedL(bits)); mirroredRes.isValid()) {
		mirroredRes.setIsMirrored(true);
		return mirroredRes;
	}

	return res;
}